

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  uint uVar6;
  Scene *pSVar7;
  float **ppfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  uint uVar59;
  undefined1 (*pauVar60) [16];
  long lVar61;
  ulong uVar62;
  long lVar63;
  uint uVar64;
  ulong uVar65;
  undefined1 (*pauVar66) [16];
  ulong uVar67;
  undefined1 (*pauVar68) [16];
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  undefined1 (*pauVar72) [16];
  ulong uVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar81 [32];
  undefined1 auVar80 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar92 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar104;
  float fVar109;
  undefined1 auVar105 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  float fVar119;
  undefined1 auVar120 [32];
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar121 [64];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  undefined4 uVar137;
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_29d0 [16];
  undefined1 (*local_29b8) [16];
  long local_29b0;
  long local_29a8;
  ulong local_29a0;
  ulong local_2998;
  RTCFilterFunctionNArguments local_2990;
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  RTCHitN local_2890 [16];
  undefined1 local_2880 [16];
  undefined1 local_2870 [16];
  undefined1 local_2860 [16];
  undefined4 local_2850;
  undefined4 uStack_284c;
  undefined4 uStack_2848;
  undefined4 uStack_2844;
  undefined1 local_2840 [16];
  undefined1 local_2830 [16];
  uint local_2820;
  uint uStack_281c;
  uint uStack_2818;
  uint uStack_2814;
  uint uStack_2810;
  uint uStack_280c;
  uint uStack_2808;
  uint uStack_2804;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  float local_26c0 [4];
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  undefined4 uStack_26a4;
  float local_26a0 [4];
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  undefined4 uStack_2684;
  float local_2680 [4];
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  undefined4 uStack_2664;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [8];
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar60 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar137 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_2540._4_4_ = uVar137;
  local_2540._0_4_ = uVar137;
  local_2540._8_4_ = uVar137;
  local_2540._12_4_ = uVar137;
  local_2540._16_4_ = uVar137;
  local_2540._20_4_ = uVar137;
  local_2540._24_4_ = uVar137;
  local_2540._28_4_ = uVar137;
  auVar116 = ZEXT3264(local_2540);
  uVar137 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_2560._4_4_ = uVar137;
  local_2560._0_4_ = uVar137;
  local_2560._8_4_ = uVar137;
  local_2560._12_4_ = uVar137;
  local_2560._16_4_ = uVar137;
  local_2560._20_4_ = uVar137;
  local_2560._24_4_ = uVar137;
  local_2560._28_4_ = uVar137;
  auVar118 = ZEXT3264(local_2560);
  uVar137 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2580._4_4_ = uVar137;
  local_2580._0_4_ = uVar137;
  local_2580._8_4_ = uVar137;
  local_2580._12_4_ = uVar137;
  local_2580._16_4_ = uVar137;
  local_2580._20_4_ = uVar137;
  local_2580._24_4_ = uVar137;
  local_2580._28_4_ = uVar137;
  auVar121 = ZEXT3264(local_2580);
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar33 = fVar1 * 0.99999964;
  local_25a0._4_4_ = fVar33;
  local_25a0._0_4_ = fVar33;
  local_25a0._8_4_ = fVar33;
  local_25a0._12_4_ = fVar33;
  local_25a0._16_4_ = fVar33;
  local_25a0._20_4_ = fVar33;
  local_25a0._24_4_ = fVar33;
  local_25a0._28_4_ = fVar33;
  auVar130 = ZEXT3264(local_25a0);
  fVar33 = fVar2 * 0.99999964;
  local_25c0._4_4_ = fVar33;
  local_25c0._0_4_ = fVar33;
  local_25c0._8_4_ = fVar33;
  local_25c0._12_4_ = fVar33;
  local_25c0._16_4_ = fVar33;
  local_25c0._20_4_ = fVar33;
  local_25c0._24_4_ = fVar33;
  local_25c0._28_4_ = fVar33;
  auVar133 = ZEXT3264(local_25c0);
  fVar33 = fVar3 * 0.99999964;
  local_25e0._4_4_ = fVar33;
  local_25e0._0_4_ = fVar33;
  local_25e0._8_4_ = fVar33;
  local_25e0._12_4_ = fVar33;
  local_25e0._16_4_ = fVar33;
  local_25e0._20_4_ = fVar33;
  local_25e0._24_4_ = fVar33;
  local_25e0._28_4_ = fVar33;
  auVar136 = ZEXT3264(local_25e0);
  fVar1 = fVar1 * 1.0000004;
  local_2600._4_4_ = fVar1;
  local_2600._0_4_ = fVar1;
  local_2600._8_4_ = fVar1;
  local_2600._12_4_ = fVar1;
  local_2600._16_4_ = fVar1;
  local_2600._20_4_ = fVar1;
  local_2600._24_4_ = fVar1;
  local_2600._28_4_ = fVar1;
  auVar139 = ZEXT3264(local_2600);
  fVar2 = fVar2 * 1.0000004;
  local_2620._4_4_ = fVar2;
  local_2620._0_4_ = fVar2;
  local_2620._8_4_ = fVar2;
  local_2620._12_4_ = fVar2;
  local_2620._16_4_ = fVar2;
  local_2620._20_4_ = fVar2;
  local_2620._24_4_ = fVar2;
  local_2620._28_4_ = fVar2;
  auVar141 = ZEXT3264(local_2620);
  fVar3 = fVar3 * 1.0000004;
  local_2640._4_4_ = fVar3;
  local_2640._0_4_ = fVar3;
  local_2640._8_4_ = fVar3;
  local_2640._12_4_ = fVar3;
  local_2640._16_4_ = fVar3;
  local_2640._20_4_ = fVar3;
  local_2640._24_4_ = fVar3;
  local_2640._28_4_ = fVar3;
  auVar143 = ZEXT3264(local_2640);
  uVar70 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2998 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar71 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_29a0 = uVar70 ^ 0x20;
  uVar73 = local_2998 ^ 0x20;
  iVar4 = (tray->tnear).field_0.i[k];
  local_2940._4_4_ = iVar4;
  local_2940._0_4_ = iVar4;
  local_2940._8_4_ = iVar4;
  local_2940._12_4_ = iVar4;
  local_2940._16_4_ = iVar4;
  local_2940._20_4_ = iVar4;
  local_2940._24_4_ = iVar4;
  local_2940._28_4_ = iVar4;
  auVar145 = ZEXT3264(local_2940);
  iVar4 = (tray->tfar).field_0.i[k];
  auVar78 = ZEXT3264(CONCAT428(iVar4,CONCAT424(iVar4,CONCAT420(iVar4,CONCAT416(iVar4,CONCAT412(iVar4
                                                  ,CONCAT48(iVar4,CONCAT44(iVar4,iVar4))))))));
  local_2500._16_16_ = mm_lookupmask_ps._240_16_;
  local_2500._0_16_ = mm_lookupmask_ps._0_16_;
  local_29b8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar94._8_4_ = 0x3f800000;
  auVar94._0_8_ = 0x3f8000003f800000;
  auVar94._12_4_ = 0x3f800000;
  auVar94._16_4_ = 0x3f800000;
  auVar94._20_4_ = 0x3f800000;
  auVar94._24_4_ = 0x3f800000;
  auVar94._28_4_ = 0x3f800000;
  auVar81._8_4_ = 0xbf800000;
  auVar81._0_8_ = 0xbf800000bf800000;
  auVar81._12_4_ = 0xbf800000;
  auVar81._16_4_ = 0xbf800000;
  auVar81._20_4_ = 0xbf800000;
  auVar81._24_4_ = 0xbf800000;
  auVar81._28_4_ = 0xbf800000;
  _local_2520 = vblendvps_avx(auVar94,auVar81,local_2500);
LAB_005e6872:
  do {
    pauVar72 = pauVar60 + -1;
    pauVar60 = pauVar60 + -1;
    if (*(float *)(*pauVar72 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar67 = *(ulong *)*pauVar60;
      while ((uVar67 & 8) == 0) {
        auVar114 = auVar116._0_32_;
        auVar81 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + uVar70),auVar114);
        auVar86._4_4_ = auVar130._4_4_ * auVar81._4_4_;
        auVar86._0_4_ = auVar130._0_4_ * auVar81._0_4_;
        auVar86._8_4_ = auVar130._8_4_ * auVar81._8_4_;
        auVar86._12_4_ = auVar130._12_4_ * auVar81._12_4_;
        auVar86._16_4_ = auVar130._16_4_ * auVar81._16_4_;
        auVar86._20_4_ = auVar130._20_4_ * auVar81._20_4_;
        auVar86._24_4_ = auVar130._24_4_ * auVar81._24_4_;
        auVar86._28_4_ = auVar81._28_4_;
        auVar117 = auVar118._0_32_;
        auVar81 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + local_2998),auVar117);
        auVar39._4_4_ = auVar133._4_4_ * auVar81._4_4_;
        auVar39._0_4_ = auVar133._0_4_ * auVar81._0_4_;
        auVar39._8_4_ = auVar133._8_4_ * auVar81._8_4_;
        auVar39._12_4_ = auVar133._12_4_ * auVar81._12_4_;
        auVar39._16_4_ = auVar133._16_4_ * auVar81._16_4_;
        auVar39._20_4_ = auVar133._20_4_ * auVar81._20_4_;
        auVar39._24_4_ = auVar133._24_4_ * auVar81._24_4_;
        auVar39._28_4_ = auVar81._28_4_;
        auVar81 = vmaxps_avx(auVar86,auVar39);
        auVar86 = auVar121._0_32_;
        auVar94 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + uVar71),auVar86);
        auVar34._4_4_ = auVar136._4_4_ * auVar94._4_4_;
        auVar34._0_4_ = auVar136._0_4_ * auVar94._0_4_;
        auVar34._8_4_ = auVar136._8_4_ * auVar94._8_4_;
        auVar34._12_4_ = auVar136._12_4_ * auVar94._12_4_;
        auVar34._16_4_ = auVar136._16_4_ * auVar94._16_4_;
        auVar34._20_4_ = auVar136._20_4_ * auVar94._20_4_;
        auVar34._24_4_ = auVar136._24_4_ * auVar94._24_4_;
        auVar34._28_4_ = auVar94._28_4_;
        auVar94 = vmaxps_avx(auVar34,auVar145._0_32_);
        local_2800 = vmaxps_avx(auVar81,auVar94);
        auVar81 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + local_29a0),auVar114);
        auVar35._4_4_ = auVar139._4_4_ * auVar81._4_4_;
        auVar35._0_4_ = auVar139._0_4_ * auVar81._0_4_;
        auVar35._8_4_ = auVar139._8_4_ * auVar81._8_4_;
        auVar35._12_4_ = auVar139._12_4_ * auVar81._12_4_;
        auVar35._16_4_ = auVar139._16_4_ * auVar81._16_4_;
        auVar35._20_4_ = auVar139._20_4_ * auVar81._20_4_;
        auVar35._24_4_ = auVar139._24_4_ * auVar81._24_4_;
        auVar35._28_4_ = auVar81._28_4_;
        auVar81 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + uVar73),auVar117);
        auVar36._4_4_ = auVar141._4_4_ * auVar81._4_4_;
        auVar36._0_4_ = auVar141._0_4_ * auVar81._0_4_;
        auVar36._8_4_ = auVar141._8_4_ * auVar81._8_4_;
        auVar36._12_4_ = auVar141._12_4_ * auVar81._12_4_;
        auVar36._16_4_ = auVar141._16_4_ * auVar81._16_4_;
        auVar36._20_4_ = auVar141._20_4_ * auVar81._20_4_;
        auVar36._24_4_ = auVar141._24_4_ * auVar81._24_4_;
        auVar36._28_4_ = auVar81._28_4_;
        auVar81 = vminps_avx(auVar35,auVar36);
        auVar94 = vsubps_avx(*(undefined1 (*) [32])(uVar67 + 0x40 + (uVar71 ^ 0x20)),auVar86);
        auVar37._4_4_ = auVar143._4_4_ * auVar94._4_4_;
        auVar37._0_4_ = auVar143._0_4_ * auVar94._0_4_;
        auVar37._8_4_ = auVar143._8_4_ * auVar94._8_4_;
        auVar37._12_4_ = auVar143._12_4_ * auVar94._12_4_;
        auVar37._16_4_ = auVar143._16_4_ * auVar94._16_4_;
        auVar37._20_4_ = auVar143._20_4_ * auVar94._20_4_;
        auVar37._24_4_ = auVar143._24_4_ * auVar94._24_4_;
        auVar37._28_4_ = auVar94._28_4_;
        auVar94 = vminps_avx(auVar37,auVar78._0_32_);
        auVar81 = vminps_avx(auVar81,auVar94);
        auVar81 = vcmpps_avx(local_2800,auVar81,2);
        uVar64 = vmovmskps_avx(auVar81);
        if (uVar64 == 0) {
          if (pauVar60 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_005e6872;
        }
        uVar64 = uVar64 & 0xff;
        uVar62 = uVar67 & 0xfffffffffffffff0;
        lVar63 = 0;
        for (uVar67 = (ulong)uVar64; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
          lVar63 = lVar63 + 1;
        }
        uVar67 = *(ulong *)(uVar62 + lVar63 * 8);
        uVar64 = uVar64 - 1 & uVar64;
        uVar65 = (ulong)uVar64;
        if (uVar64 != 0) {
          uVar59 = *(uint *)(local_2800 + lVar63 * 4);
          lVar63 = 0;
          for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
            lVar63 = lVar63 + 1;
          }
          uVar64 = uVar64 - 1 & uVar64;
          uVar69 = (ulong)uVar64;
          uVar65 = *(ulong *)(uVar62 + lVar63 * 8);
          uVar6 = *(uint *)(local_2800 + lVar63 * 4);
          if (uVar64 == 0) {
            if (uVar59 < uVar6) {
              *(ulong *)*pauVar60 = uVar65;
              *(uint *)(*pauVar60 + 8) = uVar6;
              pauVar60 = pauVar60 + 1;
            }
            else {
              *(ulong *)*pauVar60 = uVar67;
              *(uint *)(*pauVar60 + 8) = uVar59;
              pauVar60 = pauVar60 + 1;
              uVar67 = uVar65;
            }
          }
          else {
            auVar79._8_8_ = 0;
            auVar79._0_8_ = uVar67;
            auVar79 = vpunpcklqdq_avx(auVar79,ZEXT416(uVar59));
            auVar88._8_8_ = 0;
            auVar88._0_8_ = uVar65;
            auVar88 = vpunpcklqdq_avx(auVar88,ZEXT416(uVar6));
            lVar63 = 0;
            for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
              lVar63 = lVar63 + 1;
            }
            uVar64 = uVar64 - 1 & uVar64;
            uVar67 = (ulong)uVar64;
            auVar92._8_8_ = 0;
            auVar92._0_8_ = *(ulong *)(uVar62 + lVar63 * 8);
            auVar80 = vpunpcklqdq_avx(auVar92,ZEXT416(*(uint *)(local_2800 + lVar63 * 4)));
            auVar92 = vpcmpgtd_avx(auVar88,auVar79);
            if (uVar64 == 0) {
              auVar105 = vpshufd_avx(auVar92,0xaa);
              auVar92 = vblendvps_avx(auVar88,auVar79,auVar105);
              auVar79 = vblendvps_avx(auVar79,auVar88,auVar105);
              auVar88 = vpcmpgtd_avx(auVar80,auVar92);
              auVar105 = vpshufd_avx(auVar88,0xaa);
              auVar88 = vblendvps_avx(auVar80,auVar92,auVar105);
              auVar92 = vblendvps_avx(auVar92,auVar80,auVar105);
              auVar80 = vpcmpgtd_avx(auVar92,auVar79);
              auVar105 = vpshufd_avx(auVar80,0xaa);
              auVar80 = vblendvps_avx(auVar92,auVar79,auVar105);
              auVar79 = vblendvps_avx(auVar79,auVar92,auVar105);
              *pauVar60 = auVar79;
              pauVar60[1] = auVar80;
              uVar67 = auVar88._0_8_;
              pauVar60 = pauVar60 + 2;
            }
            else {
              lVar63 = 0;
              for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                lVar63 = lVar63 + 1;
              }
              uVar64 = uVar64 - 1 & uVar64;
              uVar65 = (ulong)uVar64;
              auVar105._8_8_ = 0;
              auVar105._0_8_ = *(ulong *)(uVar62 + lVar63 * 8);
              auVar105 = vpunpcklqdq_avx(auVar105,ZEXT416(*(uint *)(local_2800 + lVar63 * 4)));
              if (uVar64 == 0) {
                auVar93 = vpshufd_avx(auVar92,0xaa);
                auVar92 = vblendvps_avx(auVar88,auVar79,auVar93);
                auVar79 = vblendvps_avx(auVar79,auVar88,auVar93);
                auVar88 = vpcmpgtd_avx(auVar105,auVar80);
                auVar93 = vpshufd_avx(auVar88,0xaa);
                auVar88 = vblendvps_avx(auVar105,auVar80,auVar93);
                auVar80 = vblendvps_avx(auVar80,auVar105,auVar93);
                auVar105 = vpcmpgtd_avx(auVar80,auVar79);
                auVar93 = vpshufd_avx(auVar105,0xaa);
                auVar105 = vblendvps_avx(auVar80,auVar79,auVar93);
                auVar79 = vblendvps_avx(auVar79,auVar80,auVar93);
                auVar80 = vpcmpgtd_avx(auVar88,auVar92);
                auVar93 = vpshufd_avx(auVar80,0xaa);
                auVar80 = vblendvps_avx(auVar88,auVar92,auVar93);
                auVar88 = vblendvps_avx(auVar92,auVar88,auVar93);
                auVar92 = vpcmpgtd_avx(auVar105,auVar88);
                auVar93 = vpshufd_avx(auVar92,0xaa);
                auVar92 = vblendvps_avx(auVar105,auVar88,auVar93);
                auVar88 = vblendvps_avx(auVar88,auVar105,auVar93);
                *pauVar60 = auVar79;
                pauVar60[1] = auVar88;
                pauVar60[2] = auVar92;
                uVar67 = auVar80._0_8_;
                pauVar72 = pauVar60 + 3;
              }
              else {
                *pauVar60 = auVar79;
                pauVar60[1] = auVar88;
                pauVar60[2] = auVar80;
                pauVar60[3] = auVar105;
                lVar63 = 0x30;
                do {
                  lVar61 = lVar63;
                  lVar63 = 0;
                  for (uVar67 = uVar65; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000
                      ) {
                    lVar63 = lVar63 + 1;
                  }
                  uVar67 = *(ulong *)(uVar62 + lVar63 * 8);
                  auVar80._8_8_ = 0;
                  auVar80._0_8_ = uVar67;
                  auVar79 = vpunpcklqdq_avx(auVar80,ZEXT416(*(uint *)(local_2800 + lVar63 * 4)));
                  *(undefined1 (*) [16])(pauVar60[1] + lVar61) = auVar79;
                  uVar65 = uVar65 - 1 & uVar65;
                  lVar63 = lVar61 + 0x10;
                } while (uVar65 != 0);
                pauVar72 = (undefined1 (*) [16])(pauVar60[1] + lVar61);
                if (lVar61 + 0x10 != 0) {
                  lVar63 = 0x10;
                  pauVar66 = pauVar60;
                  do {
                    auVar79 = pauVar66[1];
                    pauVar66 = pauVar66 + 1;
                    uVar64 = vextractps_avx(auVar79,2);
                    lVar61 = lVar63;
                    do {
                      if (uVar64 <= *(uint *)(pauVar60[-1] + lVar61 + 8)) {
                        pauVar68 = (undefined1 (*) [16])(*pauVar60 + lVar61);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar60 + lVar61) =
                           *(undefined1 (*) [16])(pauVar60[-1] + lVar61);
                      lVar61 = lVar61 + -0x10;
                      pauVar68 = pauVar60;
                    } while (lVar61 != 0);
                    *pauVar68 = auVar79;
                    lVar63 = lVar63 + 0x10;
                  } while (pauVar72 != pauVar66);
                  uVar67 = *(ulong *)*pauVar72;
                }
              }
              auVar116 = ZEXT3264(auVar114);
              auVar118 = ZEXT3264(auVar117);
              auVar121 = ZEXT3264(auVar86);
              auVar130 = ZEXT3264(auVar130._0_32_);
              auVar133 = ZEXT3264(auVar133._0_32_);
              auVar136 = ZEXT3264(auVar136._0_32_);
              auVar139 = ZEXT3264(auVar139._0_32_);
              auVar141 = ZEXT3264(auVar141._0_32_);
              auVar143 = ZEXT3264(auVar143._0_32_);
              auVar145 = ZEXT3264(local_2940);
              pauVar60 = pauVar72;
            }
          }
        }
      }
      local_29b0 = (ulong)((uint)uVar67 & 0xf) - 8;
      if (local_29b0 != 0) {
        uVar67 = uVar67 & 0xfffffffffffffff0;
        local_29a8 = 0;
        do {
          lVar61 = local_29a8 * 0x60;
          pSVar7 = context->scene;
          ppfVar8 = (pSVar7->vertices).items;
          pfVar9 = ppfVar8[*(uint *)(uVar67 + 0x40 + lVar61)];
          auVar89._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar67 + 0x20 + lVar61));
          auVar89._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar67 + lVar61));
          pfVar10 = ppfVar8[*(uint *)(uVar67 + 0x48 + lVar61)];
          auVar95._16_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar67 + 0x28 + lVar61));
          auVar95._0_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar67 + 8 + lVar61));
          pfVar11 = ppfVar8[*(uint *)(uVar67 + 0x44 + lVar61)];
          auVar106._16_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar67 + 0x24 + lVar61));
          auVar106._0_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar67 + 4 + lVar61));
          pfVar12 = ppfVar8[*(uint *)(uVar67 + 0x4c + lVar61)];
          auVar128._16_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar67 + 0x2c + lVar61));
          auVar128._0_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar67 + 0xc + lVar61));
          lVar63 = uVar67 + 0x40 + lVar61;
          local_23c0 = *(undefined8 *)(lVar63 + 0x10);
          uStack_23b8 = *(undefined8 *)(lVar63 + 0x18);
          uStack_23b0 = local_23c0;
          uStack_23a8 = uStack_23b8;
          lVar63 = uVar67 + 0x50 + lVar61;
          local_28c0 = *(undefined8 *)(lVar63 + 0x10);
          uStack_28b8 = *(undefined8 *)(lVar63 + 0x18);
          auVar92 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar67 + 0x10 + lVar61))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar67 + 0x18 + lVar61)));
          auVar79 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar67 + 0x10 + lVar61))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar67 + 0x18 + lVar61)));
          auVar80 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar67 + 0x14 + lVar61)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar67 + 0x1c + lVar61)));
          auVar88 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar67 + 0x14 + lVar61)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar67 + 0x1c + lVar61)));
          auVar105 = vunpcklps_avx(auVar79,auVar88);
          auVar93 = vunpcklps_avx(auVar92,auVar80);
          auVar79 = vunpckhps_avx(auVar92,auVar80);
          auVar80 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar67 + 0x30 + lVar61))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar67 + 0x38 + lVar61)));
          auVar88 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar67 + 0x30 + lVar61))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar67 + 0x38 + lVar61)));
          auVar74 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar67 + 0x34 + lVar61)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar67 + 0x3c + lVar61)));
          auVar92 = vunpckhps_avx(*(undefined1 (*) [16])
                                   (pfVar11 + *(uint *)(uVar67 + 0x34 + lVar61)),
                                  *(undefined1 (*) [16])
                                   (pfVar12 + *(uint *)(uVar67 + 0x3c + lVar61)));
          auVar92 = vunpcklps_avx(auVar88,auVar92);
          auVar38 = vunpcklps_avx(auVar80,auVar74);
          auVar88 = vunpckhps_avx(auVar80,auVar74);
          uStack_28b0 = local_28c0;
          uStack_28a8 = uStack_28b8;
          auVar81 = vunpcklps_avx(auVar106,auVar128);
          auVar94 = vunpcklps_avx(auVar89,auVar95);
          auVar39 = vunpcklps_avx(auVar94,auVar81);
          auVar81 = vunpckhps_avx(auVar94,auVar81);
          auVar94 = vunpckhps_avx(auVar106,auVar128);
          auVar86 = vunpckhps_avx(auVar89,auVar95);
          auVar94 = vunpcklps_avx(auVar86,auVar94);
          auVar96._16_16_ = auVar93;
          auVar96._0_16_ = auVar93;
          auVar107._16_16_ = auVar79;
          auVar107._0_16_ = auVar79;
          auVar82._16_16_ = auVar105;
          auVar82._0_16_ = auVar105;
          auVar144._16_16_ = auVar38;
          auVar144._0_16_ = auVar38;
          auVar99._16_16_ = auVar88;
          auVar99._0_16_ = auVar88;
          uVar137 = *(undefined4 *)(ray + k * 4);
          auVar120._4_4_ = uVar137;
          auVar120._0_4_ = uVar137;
          auVar120._8_4_ = uVar137;
          auVar120._12_4_ = uVar137;
          auVar120._16_4_ = uVar137;
          auVar120._20_4_ = uVar137;
          auVar120._24_4_ = uVar137;
          auVar120._28_4_ = uVar137;
          uVar137 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar134._4_4_ = uVar137;
          auVar134._0_4_ = uVar137;
          auVar134._8_4_ = uVar137;
          auVar134._12_4_ = uVar137;
          auVar134._16_4_ = uVar137;
          auVar134._20_4_ = uVar137;
          auVar134._24_4_ = uVar137;
          auVar134._28_4_ = uVar137;
          auVar75._16_16_ = auVar92;
          auVar75._0_16_ = auVar92;
          uVar137 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar140._4_4_ = uVar137;
          auVar140._0_4_ = uVar137;
          auVar140._8_4_ = uVar137;
          auVar140._12_4_ = uVar137;
          auVar140._16_4_ = uVar137;
          auVar140._20_4_ = uVar137;
          auVar140._24_4_ = uVar137;
          auVar140._28_4_ = uVar137;
          auVar39 = vsubps_avx(auVar39,auVar120);
          auVar34 = vsubps_avx(auVar81,auVar134);
          local_2920 = vsubps_avx(auVar94,auVar140);
          auVar81 = vsubps_avx(auVar96,auVar120);
          auVar94 = vsubps_avx(auVar107,auVar134);
          auVar86 = vsubps_avx(auVar82,auVar140);
          auVar35 = vsubps_avx(auVar144,auVar120);
          auVar36 = vsubps_avx(auVar99,auVar134);
          auVar37 = vsubps_avx(auVar75,auVar140);
          local_23e0 = vsubps_avx(auVar35,auVar39);
          local_2420 = vsubps_avx(auVar36,auVar34);
          local_2400 = vsubps_avx(auVar37,local_2920);
          auVar76._0_4_ = auVar39._0_4_ + auVar35._0_4_;
          auVar76._4_4_ = auVar39._4_4_ + auVar35._4_4_;
          auVar76._8_4_ = auVar39._8_4_ + auVar35._8_4_;
          auVar76._12_4_ = auVar39._12_4_ + auVar35._12_4_;
          auVar76._16_4_ = auVar39._16_4_ + auVar35._16_4_;
          auVar76._20_4_ = auVar39._20_4_ + auVar35._20_4_;
          auVar76._24_4_ = auVar39._24_4_ + auVar35._24_4_;
          auVar76._28_4_ = auVar39._28_4_ + auVar35._28_4_;
          auVar90._0_4_ = auVar34._0_4_ + auVar36._0_4_;
          auVar90._4_4_ = auVar34._4_4_ + auVar36._4_4_;
          auVar90._8_4_ = auVar34._8_4_ + auVar36._8_4_;
          auVar90._12_4_ = auVar34._12_4_ + auVar36._12_4_;
          auVar90._16_4_ = auVar34._16_4_ + auVar36._16_4_;
          auVar90._20_4_ = auVar34._20_4_ + auVar36._20_4_;
          auVar90._24_4_ = auVar34._24_4_ + auVar36._24_4_;
          auVar90._28_4_ = auVar34._28_4_ + auVar36._28_4_;
          fVar1 = local_2920._0_4_;
          auVar100._0_4_ = auVar37._0_4_ + fVar1;
          fVar2 = local_2920._4_4_;
          auVar100._4_4_ = auVar37._4_4_ + fVar2;
          fVar3 = local_2920._8_4_;
          auVar100._8_4_ = auVar37._8_4_ + fVar3;
          fVar33 = local_2920._12_4_;
          auVar100._12_4_ = auVar37._12_4_ + fVar33;
          fVar15 = local_2920._16_4_;
          auVar100._16_4_ = auVar37._16_4_ + fVar15;
          fVar16 = local_2920._20_4_;
          auVar100._20_4_ = auVar37._20_4_ + fVar16;
          fVar17 = local_2920._24_4_;
          auVar100._24_4_ = auVar37._24_4_ + fVar17;
          fVar104 = local_2920._28_4_;
          auVar100._28_4_ = auVar37._28_4_ + fVar104;
          auVar114._4_4_ = local_2400._4_4_ * auVar90._4_4_;
          auVar114._0_4_ = local_2400._0_4_ * auVar90._0_4_;
          auVar114._8_4_ = local_2400._8_4_ * auVar90._8_4_;
          auVar114._12_4_ = local_2400._12_4_ * auVar90._12_4_;
          auVar114._16_4_ = local_2400._16_4_ * auVar90._16_4_;
          auVar114._20_4_ = local_2400._20_4_ * auVar90._20_4_;
          auVar114._24_4_ = local_2400._24_4_ * auVar90._24_4_;
          auVar114._28_4_ = uVar137;
          auVar88 = vfmsub231ps_fma(auVar114,local_2420,auVar100);
          auVar117._4_4_ = local_23e0._4_4_ * auVar100._4_4_;
          auVar117._0_4_ = local_23e0._0_4_ * auVar100._0_4_;
          auVar117._8_4_ = local_23e0._8_4_ * auVar100._8_4_;
          auVar117._12_4_ = local_23e0._12_4_ * auVar100._12_4_;
          auVar117._16_4_ = local_23e0._16_4_ * auVar100._16_4_;
          auVar117._20_4_ = local_23e0._20_4_ * auVar100._20_4_;
          auVar117._24_4_ = local_23e0._24_4_ * auVar100._24_4_;
          auVar117._28_4_ = auVar100._28_4_;
          auVar79 = vfmsub231ps_fma(auVar117,local_2400,auVar76);
          auVar40._4_4_ = local_2420._4_4_ * auVar76._4_4_;
          auVar40._0_4_ = local_2420._0_4_ * auVar76._0_4_;
          auVar40._8_4_ = local_2420._8_4_ * auVar76._8_4_;
          auVar40._12_4_ = local_2420._12_4_ * auVar76._12_4_;
          auVar40._16_4_ = local_2420._16_4_ * auVar76._16_4_;
          auVar40._20_4_ = local_2420._20_4_ * auVar76._20_4_;
          auVar40._24_4_ = local_2420._24_4_ * auVar76._24_4_;
          auVar40._28_4_ = auVar76._28_4_;
          auVar92 = vfmsub231ps_fma(auVar40,local_23e0,auVar90);
          uVar137 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar135._4_4_ = uVar137;
          auVar135._0_4_ = uVar137;
          auVar135._8_4_ = uVar137;
          auVar135._12_4_ = uVar137;
          auVar135._16_4_ = uVar137;
          auVar135._20_4_ = uVar137;
          auVar135._24_4_ = uVar137;
          auVar135._28_4_ = uVar137;
          local_2460 = *(float *)(ray + k * 4 + 0x60);
          auVar41._4_4_ = local_2460 * auVar92._4_4_;
          auVar41._0_4_ = local_2460 * auVar92._0_4_;
          auVar41._8_4_ = local_2460 * auVar92._8_4_;
          auVar41._12_4_ = local_2460 * auVar92._12_4_;
          auVar41._16_4_ = local_2460 * 0.0;
          auVar41._20_4_ = local_2460 * 0.0;
          auVar41._24_4_ = local_2460 * 0.0;
          auVar41._28_4_ = auVar90._28_4_;
          auVar79 = vfmadd231ps_fma(auVar41,auVar135,ZEXT1632(auVar79));
          uVar137 = *(undefined4 *)(ray + k * 4 + 0x40);
          local_2440._4_4_ = uVar137;
          local_2440._0_4_ = uVar137;
          local_2440._8_4_ = uVar137;
          local_2440._12_4_ = uVar137;
          local_2440._16_4_ = uVar137;
          local_2440._20_4_ = uVar137;
          local_2440._24_4_ = uVar137;
          local_2440._28_4_ = uVar137;
          auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),local_2440,ZEXT1632(auVar88));
          local_2480 = vsubps_avx(auVar34,auVar94);
          local_24a0 = vsubps_avx(local_2920,auVar86);
          auVar142._0_4_ = auVar34._0_4_ + auVar94._0_4_;
          auVar142._4_4_ = auVar34._4_4_ + auVar94._4_4_;
          auVar142._8_4_ = auVar34._8_4_ + auVar94._8_4_;
          auVar142._12_4_ = auVar34._12_4_ + auVar94._12_4_;
          auVar142._16_4_ = auVar34._16_4_ + auVar94._16_4_;
          auVar142._20_4_ = auVar34._20_4_ + auVar94._20_4_;
          auVar142._24_4_ = auVar34._24_4_ + auVar94._24_4_;
          auVar142._28_4_ = auVar34._28_4_ + auVar94._28_4_;
          auVar101._0_4_ = fVar1 + auVar86._0_4_;
          auVar101._4_4_ = fVar2 + auVar86._4_4_;
          auVar101._8_4_ = fVar3 + auVar86._8_4_;
          auVar101._12_4_ = fVar33 + auVar86._12_4_;
          auVar101._16_4_ = fVar15 + auVar86._16_4_;
          auVar101._20_4_ = fVar16 + auVar86._20_4_;
          auVar101._24_4_ = fVar17 + auVar86._24_4_;
          fVar119 = auVar86._28_4_;
          auVar101._28_4_ = fVar104 + fVar119;
          fVar109 = local_24a0._0_4_;
          fVar111 = local_24a0._4_4_;
          auVar42._4_4_ = auVar142._4_4_ * fVar111;
          auVar42._0_4_ = auVar142._0_4_ * fVar109;
          fVar18 = local_24a0._8_4_;
          auVar42._8_4_ = auVar142._8_4_ * fVar18;
          fVar21 = local_24a0._12_4_;
          auVar42._12_4_ = auVar142._12_4_ * fVar21;
          fVar24 = local_24a0._16_4_;
          auVar42._16_4_ = auVar142._16_4_ * fVar24;
          fVar27 = local_24a0._20_4_;
          auVar42._20_4_ = auVar142._20_4_ * fVar27;
          fVar30 = local_24a0._24_4_;
          auVar42._24_4_ = auVar142._24_4_ * fVar30;
          auVar42._28_4_ = fVar104;
          auVar92 = vfmsub231ps_fma(auVar42,local_2480,auVar101);
          auVar114 = vsubps_avx(auVar39,auVar81);
          fVar104 = auVar114._0_4_;
          fVar112 = auVar114._4_4_;
          auVar43._4_4_ = auVar101._4_4_ * fVar112;
          auVar43._0_4_ = auVar101._0_4_ * fVar104;
          fVar19 = auVar114._8_4_;
          auVar43._8_4_ = auVar101._8_4_ * fVar19;
          fVar22 = auVar114._12_4_;
          auVar43._12_4_ = auVar101._12_4_ * fVar22;
          fVar25 = auVar114._16_4_;
          auVar43._16_4_ = auVar101._16_4_ * fVar25;
          fVar28 = auVar114._20_4_;
          auVar43._20_4_ = auVar101._20_4_ * fVar28;
          fVar31 = auVar114._24_4_;
          auVar43._24_4_ = auVar101._24_4_ * fVar31;
          auVar43._28_4_ = auVar101._28_4_;
          auVar131._0_4_ = auVar39._0_4_ + auVar81._0_4_;
          auVar131._4_4_ = auVar39._4_4_ + auVar81._4_4_;
          auVar131._8_4_ = auVar39._8_4_ + auVar81._8_4_;
          auVar131._12_4_ = auVar39._12_4_ + auVar81._12_4_;
          auVar131._16_4_ = auVar39._16_4_ + auVar81._16_4_;
          auVar131._20_4_ = auVar39._20_4_ + auVar81._20_4_;
          auVar131._24_4_ = auVar39._24_4_ + auVar81._24_4_;
          auVar131._28_4_ = auVar39._28_4_ + auVar81._28_4_;
          auVar88 = vfmsub231ps_fma(auVar43,local_24a0,auVar131);
          fVar110 = local_2480._0_4_;
          fVar113 = local_2480._4_4_;
          auVar44._4_4_ = auVar131._4_4_ * fVar113;
          auVar44._0_4_ = auVar131._0_4_ * fVar110;
          fVar20 = local_2480._8_4_;
          auVar44._8_4_ = auVar131._8_4_ * fVar20;
          fVar23 = local_2480._12_4_;
          auVar44._12_4_ = auVar131._12_4_ * fVar23;
          fVar26 = local_2480._16_4_;
          auVar44._16_4_ = auVar131._16_4_ * fVar26;
          fVar29 = local_2480._20_4_;
          auVar44._20_4_ = auVar131._20_4_ * fVar29;
          fVar32 = local_2480._24_4_;
          auVar44._24_4_ = auVar131._24_4_ * fVar32;
          auVar44._28_4_ = local_24a0._28_4_;
          auVar80 = vfmsub231ps_fma(auVar44,auVar114,auVar142);
          auVar45._4_4_ = auVar80._4_4_ * local_2460;
          auVar45._0_4_ = auVar80._0_4_ * local_2460;
          auVar45._8_4_ = auVar80._8_4_ * local_2460;
          auVar45._12_4_ = auVar80._12_4_ * local_2460;
          auVar45._16_4_ = local_2460 * 0.0;
          auVar45._20_4_ = local_2460 * 0.0;
          auVar45._24_4_ = local_2460 * 0.0;
          auVar45._28_4_ = auVar142._28_4_;
          auVar88 = vfmadd231ps_fma(auVar45,auVar135,ZEXT1632(auVar88));
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),local_2440,ZEXT1632(auVar92));
          auVar117 = vsubps_avx(auVar81,auVar35);
          auVar97._0_4_ = auVar81._0_4_ + auVar35._0_4_;
          auVar97._4_4_ = auVar81._4_4_ + auVar35._4_4_;
          auVar97._8_4_ = auVar81._8_4_ + auVar35._8_4_;
          auVar97._12_4_ = auVar81._12_4_ + auVar35._12_4_;
          auVar97._16_4_ = auVar81._16_4_ + auVar35._16_4_;
          auVar97._20_4_ = auVar81._20_4_ + auVar35._20_4_;
          auVar97._24_4_ = auVar81._24_4_ + auVar35._24_4_;
          auVar97._28_4_ = auVar81._28_4_ + auVar35._28_4_;
          auVar35 = vsubps_avx(auVar94,auVar36);
          auVar108._0_4_ = auVar94._0_4_ + auVar36._0_4_;
          auVar108._4_4_ = auVar94._4_4_ + auVar36._4_4_;
          auVar108._8_4_ = auVar94._8_4_ + auVar36._8_4_;
          auVar108._12_4_ = auVar94._12_4_ + auVar36._12_4_;
          auVar108._16_4_ = auVar94._16_4_ + auVar36._16_4_;
          auVar108._20_4_ = auVar94._20_4_ + auVar36._20_4_;
          auVar108._24_4_ = auVar94._24_4_ + auVar36._24_4_;
          auVar108._28_4_ = auVar94._28_4_ + auVar36._28_4_;
          auVar36 = vsubps_avx(auVar86,auVar37);
          auVar83._0_4_ = auVar86._0_4_ + auVar37._0_4_;
          auVar83._4_4_ = auVar86._4_4_ + auVar37._4_4_;
          auVar83._8_4_ = auVar86._8_4_ + auVar37._8_4_;
          auVar83._12_4_ = auVar86._12_4_ + auVar37._12_4_;
          auVar83._16_4_ = auVar86._16_4_ + auVar37._16_4_;
          auVar83._20_4_ = auVar86._20_4_ + auVar37._20_4_;
          auVar83._24_4_ = auVar86._24_4_ + auVar37._24_4_;
          auVar83._28_4_ = fVar119 + auVar37._28_4_;
          auVar46._4_4_ = auVar36._4_4_ * auVar108._4_4_;
          auVar46._0_4_ = auVar36._0_4_ * auVar108._0_4_;
          auVar46._8_4_ = auVar36._8_4_ * auVar108._8_4_;
          auVar46._12_4_ = auVar36._12_4_ * auVar108._12_4_;
          auVar46._16_4_ = auVar36._16_4_ * auVar108._16_4_;
          auVar46._20_4_ = auVar36._20_4_ * auVar108._20_4_;
          auVar46._24_4_ = auVar36._24_4_ * auVar108._24_4_;
          auVar46._28_4_ = fVar119;
          auVar80 = vfmsub231ps_fma(auVar46,auVar35,auVar83);
          auVar47._4_4_ = auVar83._4_4_ * auVar117._4_4_;
          auVar47._0_4_ = auVar83._0_4_ * auVar117._0_4_;
          auVar47._8_4_ = auVar83._8_4_ * auVar117._8_4_;
          auVar47._12_4_ = auVar83._12_4_ * auVar117._12_4_;
          auVar47._16_4_ = auVar83._16_4_ * auVar117._16_4_;
          auVar47._20_4_ = auVar83._20_4_ * auVar117._20_4_;
          auVar47._24_4_ = auVar83._24_4_ * auVar117._24_4_;
          auVar47._28_4_ = auVar83._28_4_;
          auVar92 = vfmsub231ps_fma(auVar47,auVar36,auVar97);
          auVar48._4_4_ = auVar35._4_4_ * auVar97._4_4_;
          auVar48._0_4_ = auVar35._0_4_ * auVar97._0_4_;
          auVar48._8_4_ = auVar35._8_4_ * auVar97._8_4_;
          auVar48._12_4_ = auVar35._12_4_ * auVar97._12_4_;
          auVar48._16_4_ = auVar35._16_4_ * auVar97._16_4_;
          auVar48._20_4_ = auVar35._20_4_ * auVar97._20_4_;
          auVar48._24_4_ = auVar35._24_4_ * auVar97._24_4_;
          auVar48._28_4_ = auVar97._28_4_;
          auVar105 = vfmsub231ps_fma(auVar48,auVar117,auVar108);
          fStack_245c = local_2460;
          fStack_2458 = local_2460;
          fStack_2454 = local_2460;
          fStack_2450 = local_2460;
          fStack_244c = local_2460;
          fStack_2448 = local_2460;
          fStack_2444 = local_2460;
          auVar98._0_4_ = local_2460 * auVar105._0_4_;
          auVar98._4_4_ = local_2460 * auVar105._4_4_;
          auVar98._8_4_ = local_2460 * auVar105._8_4_;
          auVar98._12_4_ = local_2460 * auVar105._12_4_;
          auVar98._16_4_ = local_2460 * 0.0;
          auVar98._20_4_ = local_2460 * 0.0;
          auVar98._24_4_ = local_2460 * 0.0;
          auVar98._28_4_ = 0;
          auVar92 = vfmadd231ps_fma(auVar98,auVar135,ZEXT1632(auVar92));
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),local_2440,ZEXT1632(auVar80));
          local_27c0 = ZEXT1632(CONCAT412(auVar92._12_4_ + auVar88._12_4_ + auVar79._12_4_,
                                          CONCAT48(auVar92._8_4_ + auVar88._8_4_ + auVar79._8_4_,
                                                   CONCAT44(auVar92._4_4_ +
                                                            auVar88._4_4_ + auVar79._4_4_,
                                                            auVar92._0_4_ +
                                                            auVar88._0_4_ + auVar79._0_4_))));
          auVar84._8_4_ = 0x7fffffff;
          auVar84._0_8_ = 0x7fffffff7fffffff;
          auVar84._12_4_ = 0x7fffffff;
          auVar84._16_4_ = 0x7fffffff;
          auVar84._20_4_ = 0x7fffffff;
          auVar84._24_4_ = 0x7fffffff;
          auVar84._28_4_ = 0x7fffffff;
          local_27e0 = ZEXT1632(auVar88);
          auVar81 = vminps_avx(ZEXT1632(auVar79),local_27e0);
          auVar81 = vminps_avx(auVar81,ZEXT1632(auVar92));
          local_24e0 = vandps_avx(local_27c0,auVar84);
          fVar119 = local_24e0._0_4_ * 1.1920929e-07;
          fVar122 = local_24e0._4_4_ * 1.1920929e-07;
          auVar49._4_4_ = fVar122;
          auVar49._0_4_ = fVar119;
          fVar123 = local_24e0._8_4_ * 1.1920929e-07;
          auVar49._8_4_ = fVar123;
          fVar124 = local_24e0._12_4_ * 1.1920929e-07;
          auVar49._12_4_ = fVar124;
          fVar125 = local_24e0._16_4_ * 1.1920929e-07;
          auVar49._16_4_ = fVar125;
          fVar126 = local_24e0._20_4_ * 1.1920929e-07;
          auVar49._20_4_ = fVar126;
          fVar127 = local_24e0._24_4_ * 1.1920929e-07;
          auVar49._24_4_ = fVar127;
          auVar49._28_4_ = 0x34000000;
          auVar115._0_8_ = CONCAT44(fVar122,fVar119) ^ 0x8000000080000000;
          auVar115._8_4_ = -fVar123;
          auVar115._12_4_ = -fVar124;
          auVar115._16_4_ = -fVar125;
          auVar115._20_4_ = -fVar126;
          auVar115._24_4_ = -fVar127;
          auVar115._28_4_ = 0xb4000000;
          auVar81 = vcmpps_avx(auVar81,auVar115,5);
          local_24c0 = ZEXT1632(auVar79);
          auVar86 = vmaxps_avx(ZEXT1632(auVar79),local_27e0);
          auVar94 = vmaxps_avx(auVar86,ZEXT1632(auVar92));
          auVar94 = vcmpps_avx(auVar94,auVar49,2);
          auVar94 = vorps_avx(auVar81,auVar94);
          if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar94 >> 0x7f,0) != '\0') ||
                (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar94 >> 0xbf,0) != '\0') ||
              (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar94[0x1f] < '\0') {
            auVar50._4_4_ = fVar113 * local_2400._4_4_;
            auVar50._0_4_ = fVar110 * local_2400._0_4_;
            auVar50._8_4_ = fVar20 * local_2400._8_4_;
            auVar50._12_4_ = fVar23 * local_2400._12_4_;
            auVar50._16_4_ = fVar26 * local_2400._16_4_;
            auVar50._20_4_ = fVar29 * local_2400._20_4_;
            auVar50._24_4_ = fVar32 * local_2400._24_4_;
            auVar50._28_4_ = auVar81._28_4_;
            auVar51._4_4_ = local_2420._4_4_ * fVar112;
            auVar51._0_4_ = local_2420._0_4_ * fVar104;
            auVar51._8_4_ = local_2420._8_4_ * fVar19;
            auVar51._12_4_ = local_2420._12_4_ * fVar22;
            auVar51._16_4_ = local_2420._16_4_ * fVar25;
            auVar51._20_4_ = local_2420._20_4_ * fVar28;
            auVar51._24_4_ = local_2420._24_4_ * fVar31;
            auVar51._28_4_ = 0x34000000;
            auVar92 = vfmsub213ps_fma(local_2420,local_24a0,auVar50);
            auVar52._4_4_ = auVar35._4_4_ * fVar111;
            auVar52._0_4_ = auVar35._0_4_ * fVar109;
            auVar52._8_4_ = auVar35._8_4_ * fVar18;
            auVar52._12_4_ = auVar35._12_4_ * fVar21;
            auVar52._16_4_ = auVar35._16_4_ * fVar24;
            auVar52._20_4_ = auVar35._20_4_ * fVar27;
            auVar52._24_4_ = auVar35._24_4_ * fVar30;
            auVar52._28_4_ = auVar86._28_4_;
            auVar53._4_4_ = auVar36._4_4_ * fVar112;
            auVar53._0_4_ = auVar36._0_4_ * fVar104;
            auVar53._8_4_ = auVar36._8_4_ * fVar19;
            auVar53._12_4_ = auVar36._12_4_ * fVar22;
            auVar53._16_4_ = auVar36._16_4_ * fVar25;
            auVar53._20_4_ = auVar36._20_4_ * fVar28;
            auVar53._24_4_ = auVar36._24_4_ * fVar31;
            auVar53._28_4_ = local_24e0._28_4_;
            auVar80 = vfmsub213ps_fma(auVar36,local_2480,auVar52);
            auVar81 = vandps_avx(auVar50,auVar84);
            auVar86 = vandps_avx(auVar52,auVar84);
            auVar81 = vcmpps_avx(auVar81,auVar86,1);
            local_27a0 = vblendvps_avx(ZEXT1632(auVar80),ZEXT1632(auVar92),auVar81);
            auVar54._4_4_ = fVar113 * auVar117._4_4_;
            auVar54._0_4_ = fVar110 * auVar117._0_4_;
            auVar54._8_4_ = fVar20 * auVar117._8_4_;
            auVar54._12_4_ = fVar23 * auVar117._12_4_;
            auVar54._16_4_ = fVar26 * auVar117._16_4_;
            auVar54._20_4_ = fVar29 * auVar117._20_4_;
            auVar54._24_4_ = fVar32 * auVar117._24_4_;
            auVar54._28_4_ = auVar81._28_4_;
            auVar92 = vfmsub213ps_fma(auVar117,local_24a0,auVar53);
            auVar55._4_4_ = local_23e0._4_4_ * fVar111;
            auVar55._0_4_ = local_23e0._0_4_ * fVar109;
            auVar55._8_4_ = local_23e0._8_4_ * fVar18;
            auVar55._12_4_ = local_23e0._12_4_ * fVar21;
            auVar55._16_4_ = local_23e0._16_4_ * fVar24;
            auVar55._20_4_ = local_23e0._20_4_ * fVar27;
            auVar55._24_4_ = local_23e0._24_4_ * fVar30;
            auVar55._28_4_ = auVar86._28_4_;
            auVar80 = vfmsub213ps_fma(local_2400,auVar114,auVar55);
            auVar81 = vandps_avx(auVar55,auVar84);
            auVar86 = vandps_avx(auVar53,auVar84);
            auVar81 = vcmpps_avx(auVar81,auVar86,1);
            local_2780 = vblendvps_avx(ZEXT1632(auVar92),ZEXT1632(auVar80),auVar81);
            auVar92 = vfmsub213ps_fma(local_23e0,local_2480,auVar51);
            auVar80 = vfmsub213ps_fma(auVar35,auVar114,auVar54);
            auVar81 = vandps_avx(auVar51,auVar84);
            auVar86 = vandps_avx(auVar54,auVar84);
            auVar86 = vcmpps_avx(auVar81,auVar86,1);
            local_2760 = vblendvps_avx(ZEXT1632(auVar80),ZEXT1632(auVar92),auVar86);
            auVar92 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
            fVar104 = local_2760._0_4_;
            auVar85._0_4_ = fVar104 * local_2460;
            fVar119 = local_2760._4_4_;
            auVar85._4_4_ = fVar119 * local_2460;
            fVar109 = local_2760._8_4_;
            auVar85._8_4_ = fVar109 * local_2460;
            fVar110 = local_2760._12_4_;
            auVar85._12_4_ = fVar110 * local_2460;
            fVar111 = local_2760._16_4_;
            auVar85._16_4_ = fVar111 * local_2460;
            fVar112 = local_2760._20_4_;
            auVar85._20_4_ = fVar112 * local_2460;
            fVar113 = local_2760._24_4_;
            auVar85._24_4_ = fVar113 * local_2460;
            auVar85._28_4_ = 0;
            auVar80 = vfmadd213ps_fma(auVar135,local_2780,auVar85);
            auVar80 = vfmadd213ps_fma(local_2440,local_27a0,ZEXT1632(auVar80));
            auVar86 = ZEXT1632(CONCAT412(auVar80._12_4_ + auVar80._12_4_,
                                         CONCAT48(auVar80._8_4_ + auVar80._8_4_,
                                                  CONCAT44(auVar80._4_4_ + auVar80._4_4_,
                                                           auVar80._0_4_ + auVar80._0_4_))));
            auVar56._4_4_ = fVar119 * fVar2;
            auVar56._0_4_ = fVar104 * fVar1;
            auVar56._8_4_ = fVar109 * fVar3;
            auVar56._12_4_ = fVar110 * fVar33;
            auVar56._16_4_ = fVar111 * fVar15;
            auVar56._20_4_ = fVar112 * fVar16;
            auVar56._24_4_ = fVar113 * fVar17;
            auVar56._28_4_ = auVar81._28_4_;
            auVar80 = vfmadd213ps_fma(auVar34,local_2780,auVar56);
            auVar105 = vfmadd213ps_fma(auVar39,local_27a0,ZEXT1632(auVar80));
            auVar81 = vrcpps_avx(auVar86);
            auVar132._8_4_ = 0x3f800000;
            auVar132._0_8_ = 0x3f8000003f800000;
            auVar132._12_4_ = 0x3f800000;
            auVar132._16_4_ = 0x3f800000;
            auVar132._20_4_ = 0x3f800000;
            auVar132._24_4_ = 0x3f800000;
            auVar132._28_4_ = 0x3f800000;
            auVar80 = vfnmadd213ps_fma(auVar81,auVar86,auVar132);
            auVar80 = vfmadd132ps_fma(ZEXT1632(auVar80),auVar81,auVar81);
            local_26e0._28_4_ = 0x3f800000;
            local_26e0._0_28_ =
                 ZEXT1628(CONCAT412(auVar80._12_4_ * (auVar105._12_4_ + auVar105._12_4_),
                                    CONCAT48(auVar80._8_4_ * (auVar105._8_4_ + auVar105._8_4_),
                                             CONCAT44(auVar80._4_4_ *
                                                      (auVar105._4_4_ + auVar105._4_4_),
                                                      auVar80._0_4_ *
                                                      (auVar105._0_4_ + auVar105._0_4_)))));
            auVar116 = ZEXT3264(local_26e0);
            uVar137 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar102._4_4_ = uVar137;
            auVar102._0_4_ = uVar137;
            auVar102._8_4_ = uVar137;
            auVar102._12_4_ = uVar137;
            auVar102._16_4_ = uVar137;
            auVar102._20_4_ = uVar137;
            auVar102._24_4_ = uVar137;
            auVar102._28_4_ = uVar137;
            uVar137 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar138._4_4_ = uVar137;
            auVar138._0_4_ = uVar137;
            auVar138._8_4_ = uVar137;
            auVar138._12_4_ = uVar137;
            auVar138._16_4_ = uVar137;
            auVar138._20_4_ = uVar137;
            auVar138._24_4_ = uVar137;
            auVar138._28_4_ = uVar137;
            auVar118 = ZEXT3264(auVar138);
            auVar81 = vcmpps_avx(auVar102,local_26e0,2);
            auVar94 = vcmpps_avx(local_26e0,auVar138,2);
            auVar81 = vandps_avx(auVar94,auVar81);
            auVar80 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
            auVar92 = vpand_avx(auVar80,auVar92);
            auVar81 = vpmovsxwd_avx2(auVar92);
            if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar81 >> 0x7f,0) != '\0') ||
                  (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar81 >> 0xbf,0) != '\0') ||
                (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar81[0x1f] < '\0') {
              auVar81 = vcmpps_avx(auVar86,_DAT_01faff00,4);
              auVar80 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
              auVar92 = vpand_avx(auVar92,auVar80);
              local_2960 = vpmovsxwd_avx2(auVar92);
              if ((((((((local_2960 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_2960 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_2960 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_2960 >> 0x7f,0) != '\0') ||
                    (local_2960 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_2960 >> 0xbf,0) != '\0') ||
                  (local_2960 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_2960[0x1f] < '\0') {
                local_2800 = ZEXT1632(auVar79);
                local_2740 = local_2960;
                local_2660 = local_2500;
                auVar81 = vrcpps_avx(local_27c0);
                auVar129._8_4_ = 0x3f800000;
                auVar129._0_8_ = 0x3f8000003f800000;
                auVar129._12_4_ = 0x3f800000;
                auVar129._16_4_ = 0x3f800000;
                auVar129._20_4_ = 0x3f800000;
                auVar129._24_4_ = 0x3f800000;
                auVar129._28_4_ = 0x3f800000;
                auVar80 = vfnmadd213ps_fma(local_27c0,auVar81,auVar129);
                auVar80 = vfmadd132ps_fma(ZEXT1632(auVar80),auVar81,auVar81);
                auVar103._8_4_ = 0x219392ef;
                auVar103._0_8_ = 0x219392ef219392ef;
                auVar103._12_4_ = 0x219392ef;
                auVar103._16_4_ = 0x219392ef;
                auVar103._20_4_ = 0x219392ef;
                auVar103._24_4_ = 0x219392ef;
                auVar103._28_4_ = 0x219392ef;
                auVar81 = vcmpps_avx(local_24e0,auVar103,5);
                auVar81 = vandps_avx(auVar81,ZEXT1632(auVar80));
                auVar57._4_4_ = auVar79._4_4_ * auVar81._4_4_;
                auVar57._0_4_ = auVar79._0_4_ * auVar81._0_4_;
                auVar57._8_4_ = auVar79._8_4_ * auVar81._8_4_;
                auVar57._12_4_ = auVar79._12_4_ * auVar81._12_4_;
                auVar57._16_4_ = auVar81._16_4_ * 0.0;
                auVar57._20_4_ = auVar81._20_4_ * 0.0;
                auVar57._24_4_ = auVar81._24_4_ * 0.0;
                auVar57._28_4_ = 0;
                auVar94 = vminps_avx(auVar57,auVar129);
                auVar58._4_4_ = auVar88._4_4_ * auVar81._4_4_;
                auVar58._0_4_ = auVar88._0_4_ * auVar81._0_4_;
                auVar58._8_4_ = auVar88._8_4_ * auVar81._8_4_;
                auVar58._12_4_ = auVar88._12_4_ * auVar81._12_4_;
                auVar58._16_4_ = auVar81._16_4_ * 0.0;
                auVar58._20_4_ = auVar81._20_4_ * 0.0;
                auVar58._24_4_ = auVar81._24_4_ * 0.0;
                auVar58._28_4_ = auVar114._28_4_;
                auVar81 = vminps_avx(auVar58,auVar129);
                auVar86 = vsubps_avx(auVar129,auVar94);
                auVar39 = vsubps_avx(auVar129,auVar81);
                local_2700 = vblendvps_avx(auVar81,auVar86,local_2500);
                local_2720 = vblendvps_avx(auVar94,auVar39,local_2500);
                local_26c0[0] = local_27a0._0_4_ * (float)local_2520._0_4_;
                local_26c0[1] = local_27a0._4_4_ * (float)local_2520._4_4_;
                local_26c0[2] = local_27a0._8_4_ * fStack_2518;
                local_26c0[3] = local_27a0._12_4_ * fStack_2514;
                fStack_26b0 = local_27a0._16_4_ * fStack_2510;
                fStack_26ac = local_27a0._20_4_ * fStack_250c;
                fStack_26a8 = local_27a0._24_4_ * fStack_2508;
                uStack_26a4 = local_2720._28_4_;
                local_26a0[0] = (float)local_2520._0_4_ * local_2780._0_4_;
                local_26a0[1] = (float)local_2520._4_4_ * local_2780._4_4_;
                local_26a0[2] = fStack_2518 * local_2780._8_4_;
                local_26a0[3] = fStack_2514 * local_2780._12_4_;
                fStack_2690 = fStack_2510 * local_2780._16_4_;
                fStack_268c = fStack_250c * local_2780._20_4_;
                fStack_2688 = fStack_2508 * local_2780._24_4_;
                uStack_2684 = local_2700._28_4_;
                local_2680[0] = (float)local_2520._0_4_ * fVar104;
                local_2680[1] = (float)local_2520._4_4_ * fVar119;
                local_2680[2] = fStack_2518 * fVar109;
                local_2680[3] = fStack_2514 * fVar110;
                fStack_2670 = fStack_2510 * fVar111;
                fStack_266c = fStack_250c * fVar112;
                fStack_2668 = fStack_2508 * fVar113;
                uStack_2664 = uStack_2504;
                auVar81 = vpmovsxwd_avx2(auVar92);
                auVar91._8_4_ = 0x7f800000;
                auVar91._0_8_ = 0x7f8000007f800000;
                auVar91._12_4_ = 0x7f800000;
                auVar91._16_4_ = 0x7f800000;
                auVar91._20_4_ = 0x7f800000;
                auVar91._24_4_ = 0x7f800000;
                auVar91._28_4_ = 0x7f800000;
                auVar81 = vblendvps_avx(auVar91,local_26e0,auVar81);
                auVar94 = vshufps_avx(auVar81,auVar81,0xb1);
                auVar94 = vminps_avx(auVar81,auVar94);
                auVar86 = vshufpd_avx(auVar94,auVar94,5);
                auVar94 = vminps_avx(auVar94,auVar86);
                auVar86 = vpermpd_avx2(auVar94,0x4e);
                auVar94 = vminps_avx(auVar94,auVar86);
                auVar81 = vcmpps_avx(auVar81,auVar94,0);
                auVar79 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
                auVar79 = vpand_avx(auVar79,auVar92);
                auVar81 = vpmovsxwd_avx2(auVar79);
                if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar81 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar81 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar81 >> 0x7f,0) == '\0') &&
                      (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar81 >> 0xbf,0) == '\0') &&
                    (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar81[0x1f]) {
                  auVar81 = local_2960;
                }
                uVar59 = vmovmskps_avx(auVar81);
                uVar64 = 0;
                for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x80000000) {
                  uVar64 = uVar64 + 1;
                }
                do {
                  uVar62 = CONCAT44(0,uVar64);
                  uVar64 = *(uint *)((long)&local_23c0 + uVar62 * 4);
                  pGVar13 = (pSVar7->geometries).items[uVar64].ptr;
                  if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    *(undefined4 *)(local_2960 + uVar62 * 4) = 0;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar137 = *(undefined4 *)(local_2720 + uVar62 * 4);
                      uVar5 = *(undefined4 *)(local_2700 + uVar62 * 4);
                      *(float *)(ray + k * 4 + 0x80) = local_26c0[uVar62 - 8];
                      *(float *)(ray + k * 4 + 0xc0) = local_26c0[uVar62];
                      *(float *)(ray + k * 4 + 0xd0) = local_26a0[uVar62];
                      *(float *)(ray + k * 4 + 0xe0) = local_2680[uVar62];
                      *(undefined4 *)(ray + k * 4 + 0xf0) = uVar137;
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar5;
                      *(undefined4 *)(ray + k * 4 + 0x110) =
                           *(undefined4 *)((long)&local_28c0 + uVar62 * 4);
                      *(uint *)(ray + k * 4 + 0x120) = uVar64;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    uVar137 = *(undefined4 *)(local_2720 + uVar62 * 4);
                    local_2860._4_4_ = uVar137;
                    local_2860._0_4_ = uVar137;
                    local_2860._8_4_ = uVar137;
                    local_2860._12_4_ = uVar137;
                    local_2850 = *(undefined4 *)(local_2700 + uVar62 * 4);
                    local_2830._4_4_ = uVar64;
                    local_2830._0_4_ = uVar64;
                    local_2830._8_4_ = uVar64;
                    local_2830._12_4_ = uVar64;
                    uVar137 = *(undefined4 *)((long)&local_28c0 + uVar62 * 4);
                    auVar93._4_4_ = uVar137;
                    auVar93._0_4_ = uVar137;
                    auVar93._8_4_ = uVar137;
                    auVar93._12_4_ = uVar137;
                    fVar1 = local_26c0[uVar62];
                    fVar2 = local_26a0[uVar62];
                    local_2880._4_4_ = fVar2;
                    local_2880._0_4_ = fVar2;
                    local_2880._8_4_ = fVar2;
                    local_2880._12_4_ = fVar2;
                    fVar2 = local_2680[uVar62];
                    local_2870._4_4_ = fVar2;
                    local_2870._0_4_ = fVar2;
                    local_2870._8_4_ = fVar2;
                    local_2870._12_4_ = fVar2;
                    local_2890[0] = (RTCHitN)SUB41(fVar1,0);
                    local_2890[1] = (RTCHitN)(char)((uint)fVar1 >> 8);
                    local_2890[2] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
                    local_2890[3] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
                    local_2890[4] = (RTCHitN)SUB41(fVar1,0);
                    local_2890[5] = (RTCHitN)(char)((uint)fVar1 >> 8);
                    local_2890[6] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
                    local_2890[7] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
                    local_2890[8] = (RTCHitN)SUB41(fVar1,0);
                    local_2890[9] = (RTCHitN)(char)((uint)fVar1 >> 8);
                    local_2890[10] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
                    local_2890[0xb] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
                    local_2890[0xc] = (RTCHitN)SUB41(fVar1,0);
                    local_2890[0xd] = (RTCHitN)(char)((uint)fVar1 >> 8);
                    local_2890[0xe] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
                    local_2890[0xf] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
                    uStack_284c = local_2850;
                    uStack_2848 = local_2850;
                    uStack_2844 = local_2850;
                    local_2840 = auVar93;
                    vpcmpeqd_avx2(ZEXT1632(local_2860),ZEXT1632(local_2860));
                    uStack_281c = context->user->instID[0];
                    local_2820 = uStack_281c;
                    uStack_2818 = uStack_281c;
                    uStack_2814 = uStack_281c;
                    uStack_2810 = context->user->instPrimID[0];
                    uStack_280c = uStack_2810;
                    uStack_2808 = uStack_2810;
                    uStack_2804 = uStack_2810;
                    *(float *)(ray + k * 4 + 0x80) = local_26c0[uVar62 - 8];
                    local_29d0 = *local_29b8;
                    local_2990.valid = (int *)local_29d0;
                    local_2990.geometryUserPtr = pGVar13->userPtr;
                    local_2990.context = context->user;
                    local_2990.hit = local_2890;
                    local_2990.N = 4;
                    local_28e0 = auVar116._0_32_;
                    local_2900 = auVar118._0_32_;
                    local_2920._0_8_ = uVar62;
                    local_2990.ray = (RTCRayN *)ray;
                    if (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar13->intersectionFilterN)(&local_2990);
                      auVar118 = ZEXT3264(local_2900);
                      auVar116 = ZEXT3264(local_28e0);
                      uVar62 = local_2920._0_8_;
                    }
                    if (local_29d0 == (undefined1  [16])0x0) {
                      auVar79 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar79 = auVar79 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var14)(&local_2990);
                        auVar118 = ZEXT3264(local_2900);
                        auVar116 = ZEXT3264(local_28e0);
                        uVar62 = local_2920._0_8_;
                      }
                      auVar88 = vpcmpeqd_avx(local_29d0,_DAT_01f7aa10);
                      auVar92 = vpcmpeqd_avx(auVar93,auVar93);
                      auVar79 = auVar88 ^ auVar92;
                      if (local_29d0 != (undefined1  [16])0x0) {
                        auVar88 = auVar88 ^ auVar92;
                        auVar92 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])local_2990.hit);
                        *(undefined1 (*) [16])(local_2990.ray + 0xc0) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                          (local_2990.hit + 0x10));
                        *(undefined1 (*) [16])(local_2990.ray + 0xd0) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                          (local_2990.hit + 0x20));
                        *(undefined1 (*) [16])(local_2990.ray + 0xe0) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                          (local_2990.hit + 0x30));
                        *(undefined1 (*) [16])(local_2990.ray + 0xf0) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                          (local_2990.hit + 0x40));
                        *(undefined1 (*) [16])(local_2990.ray + 0x100) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                          (local_2990.hit + 0x50));
                        *(undefined1 (*) [16])(local_2990.ray + 0x110) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                          (local_2990.hit + 0x60));
                        *(undefined1 (*) [16])(local_2990.ray + 0x120) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                          (local_2990.hit + 0x70));
                        *(undefined1 (*) [16])(local_2990.ray + 0x130) = auVar92;
                        auVar88 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                          (local_2990.hit + 0x80));
                        *(undefined1 (*) [16])(local_2990.ray + 0x140) = auVar88;
                      }
                    }
                    auVar74._8_8_ = 0x100000001;
                    auVar74._0_8_ = 0x100000001;
                    if ((auVar74 & auVar79) == (undefined1  [16])0x0) {
                      *(int *)(ray + k * 4 + 0x80) = auVar118._0_4_;
                    }
                    else {
                      auVar118 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                    }
                    *(undefined4 *)(local_2960 + uVar62 * 4) = 0;
                    uVar137 = auVar118._0_4_;
                    auVar77._4_4_ = uVar137;
                    auVar77._0_4_ = uVar137;
                    auVar77._8_4_ = uVar137;
                    auVar77._12_4_ = uVar137;
                    auVar77._16_4_ = uVar137;
                    auVar77._20_4_ = uVar137;
                    auVar77._24_4_ = uVar137;
                    auVar77._28_4_ = uVar137;
                    auVar81 = vcmpps_avx(auVar116._0_32_,auVar77,2);
                    local_2960 = vandps_avx(auVar81,local_2960);
                  }
                  if ((((((((local_2960 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_2960 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_2960 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_2960 >> 0x7f,0) == '\0') &&
                        (local_2960 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_2960 >> 0xbf,0) == '\0') &&
                      (local_2960 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_2960[0x1f]) break;
                  auVar87._8_4_ = 0x7f800000;
                  auVar87._0_8_ = 0x7f8000007f800000;
                  auVar87._12_4_ = 0x7f800000;
                  auVar87._16_4_ = 0x7f800000;
                  auVar87._20_4_ = 0x7f800000;
                  auVar87._24_4_ = 0x7f800000;
                  auVar87._28_4_ = 0x7f800000;
                  auVar81 = vblendvps_avx(auVar87,auVar116._0_32_,local_2960);
                  auVar94 = vshufps_avx(auVar81,auVar81,0xb1);
                  auVar94 = vminps_avx(auVar81,auVar94);
                  auVar86 = vshufpd_avx(auVar94,auVar94,5);
                  auVar94 = vminps_avx(auVar94,auVar86);
                  auVar86 = vpermpd_avx2(auVar94,0x4e);
                  auVar94 = vminps_avx(auVar94,auVar86);
                  auVar94 = vcmpps_avx(auVar81,auVar94,0);
                  auVar86 = local_2960 & auVar94;
                  auVar81 = local_2960;
                  if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar86 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar86 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar86 >> 0x7f,0) != '\0') ||
                        (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar86 >> 0xbf,0) != '\0') ||
                      (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar86[0x1f] < '\0') {
                    auVar81 = vandps_avx(auVar94,local_2960);
                  }
                  uVar59 = vmovmskps_avx(auVar81);
                  uVar64 = 0;
                  for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x80000000) {
                    uVar64 = uVar64 + 1;
                  }
                } while( true );
              }
            }
          }
          local_29a8 = local_29a8 + 1;
        } while (local_29a8 != local_29b0);
      }
      uVar137 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar78 = ZEXT3264(CONCAT428(uVar137,CONCAT424(uVar137,CONCAT420(uVar137,CONCAT416(uVar137,
                                                  CONCAT412(uVar137,CONCAT48(uVar137,CONCAT44(
                                                  uVar137,uVar137))))))));
      auVar116 = ZEXT3264(local_2540);
      auVar118 = ZEXT3264(local_2560);
      auVar121 = ZEXT3264(local_2580);
      auVar130 = ZEXT3264(local_25a0);
      auVar133 = ZEXT3264(local_25c0);
      auVar136 = ZEXT3264(local_25e0);
      auVar139 = ZEXT3264(local_2600);
      auVar141 = ZEXT3264(local_2620);
      auVar143 = ZEXT3264(local_2640);
      auVar145 = ZEXT3264(local_2940);
    }
    if (pauVar60 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }